

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void libyuv::ScaleAddCols2_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int x_1;
  ulong uVar7;
  int local_28 [2];
  int scaletbl [2];
  
  iVar6 = dx >> 0x10;
  iVar3 = 1;
  if (1 < iVar6) {
    iVar3 = iVar6;
  }
  iVar5 = 0;
  local_28[0] = (int)(0x10000 / (long)(iVar3 * boxheight));
  iVar3 = 0;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  local_28[1] = (int)(0x10000 / (long)((iVar3 + 1) * boxheight));
  if (0 < dst_width) {
    do {
      iVar3 = x >> 0x10;
      x = x + dx;
      uVar1 = (x >> 0x10) - iVar3;
      uVar2 = (ulong)uVar1;
      if ((int)uVar1 < 2) {
        uVar2 = 1;
      }
      uVar7 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (uint)src_ptr[(long)iVar3 + uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      *dst_ptr = (uint8_t)((uint)(iVar4 * local_28[(int)uVar2 - iVar6]) >> 0x10);
      dst_ptr = dst_ptr + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != dst_width);
  }
  return;
}

Assistant:

static void ScaleAddCols2_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int i;
  int scaletbl[2];
  int minboxwidth = dx >> 16;
  int boxwidth;
  scaletbl[0] = 65536 / (MIN1(minboxwidth) * boxheight);
  scaletbl[1] = 65536 / (MIN1(minboxwidth + 1) * boxheight);
  for (i = 0; i < dst_width; ++i) {
    int ix = x >> 16;
    x += dx;
    boxwidth = MIN1((x >> 16) - ix);
    *dst_ptr++ =
        SumPixels(boxwidth, src_ptr + ix) * scaletbl[boxwidth - minboxwidth] >>
        16;
  }
}